

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ssize_t __thiscall Args::write(Args *this,int __fd,void *__buf,size_t __n)

{
  string *file_name;
  char cVar1;
  bool bVar2;
  DynamicFormat *pDVar3;
  path *this_00;
  ostream *poVar4;
  FILE *__s;
  ssize_t extraout_RAX;
  runtime_error *this_01;
  undefined4 in_register_00000034;
  string error;
  vector<char,_std::allocator<char>_> data;
  path local_c8;
  path local_a0;
  path local_78;
  string local_50;
  
  file_name = &this->output_file;
  pDVar3 = get_format(&this->output_format,(string_view)(ZEXT816(0x138b44) << 0x40),file_name);
  if (this->keep_hashed == false) {
    cVar1 = (**(code **)(*(long *)pDVar3 + 0x18))(pDVar3);
    if (cVar1 == '\0') {
      unhash(this,(Bin *)CONCAT44(in_register_00000034,__fd));
    }
  }
  if ((this->output_file)._M_string_length == 0) {
    bVar2 = std::operator==(&this->input_file,"-");
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (file_name,"-");
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&error,&this->input_file,auto_format);
      local_a0._M_pathname._0_16_ = (**(code **)(*(long *)pDVar3 + 0x10))(pDVar3);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                ((path *)&data,(basic_string_view<char,_std::char_traits<char>_> *)&local_a0,
                 auto_format);
      this_00 = (path *)std::filesystem::__cxx11::path::replace_extension((path *)&error);
      std::filesystem::__cxx11::path::generic_string(&local_c8._M_pathname,this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (file_name,&local_c8._M_pathname);
      std::__cxx11::string::~string((string *)&local_c8);
      std::filesystem::__cxx11::path::~path((path *)&data);
      std::filesystem::__cxx11::path::~path((path *)&error);
      if ((this->recursive == true) && ((this->output_dir)._M_string_length != 0)) {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&data,&this->output_dir,auto_format);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_a0,file_name,auto_format);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_78,&this->input_dir,auto_format);
        std::filesystem::relative(&local_c8,&local_a0);
        std::filesystem::__cxx11::operator/((path *)&error,(path *)&data,&local_c8);
        std::filesystem::__cxx11::path::generic_string(&local_50,(path *)&error);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (file_name,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::filesystem::__cxx11::path::~path((path *)&error);
        std::filesystem::__cxx11::path::~path(&local_c8);
        std::filesystem::__cxx11::path::~path(&local_78);
        std::filesystem::__cxx11::path::~path(&local_a0);
        std::filesystem::__cxx11::path::~path((path *)&data);
      }
    }
  }
  if (this->log == true) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Serializing...");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)pDVar3 + 0x28))(&error,pDVar3,(Bin *)CONCAT44(in_register_00000034,__fd));
  if (error._M_string_length == 0) {
    __s = (FILE *)open_file<(char)119>(this,file_name);
    if (this->log == true) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Writing data...");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    fwrite(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,1,
           (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__s);
    fflush(__s);
    fclose(__s);
    std::__cxx11::string::~string((string *)&error);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&data.super__Vector_base<char,_std::allocator<char>_>);
    return extraout_RAX;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&error);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(Bin& bin) {
        auto format = get_format(output_format, "", output_file);
        if (!keep_hashed && !format->output_allways_hashed()) {
            unhash(bin);
        }
        if (output_file.empty()) {
            if (input_file == "-") {
                output_file = "-";
            } else {
                output_file = fs::path(input_file).replace_extension(format->default_extension()).generic_string();
                if (recursive && !output_dir.empty()) {
                    output_file = (output_dir / fs::relative(output_file, input_dir)).generic_string();
                }
            }
        }

        if (log) {
            std::cerr << "Serializing..." << std::endl;
        }
        std::vector<char> data;
        auto error = format->write(bin, data);
        if (!error.empty()) {
            throw std::runtime_error(error);
        }

        auto file = open_file<'w'>(output_file);
        if (log) {
            std::cerr << "Writing data..." << std::endl;
        }
        fwrite(data.data(), 1, data.size(), file);
        fflush(file);
        fclose(file);
    }